

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O0

void QCursorData::initialize(void)

{
  QCursorData *this;
  int shape;
  CursorShape in_stack_ffffffffffffffec;
  int local_4;
  
  if (!initialized) {
    for (local_4 = 0; local_4 < 0x16; local_4 = local_4 + 1) {
      this = (QCursorData *)operator_new(0x38);
      QCursorData(this,in_stack_ffffffffffffffec);
      qt_cursorTable[local_4] = this;
    }
    initialized = true;
  }
  return;
}

Assistant:

void QCursorData::initialize()
{
    if (QCursorData::initialized)
        return;
    for (int shape = 0; shape <= Qt::LastCursor; ++shape)
        qt_cursorTable[shape] = new QCursorData((Qt::CursorShape)shape);
    QCursorData::initialized = true;
}